

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

bool __thiscall
EOPlus::Context::TriggerRule
          (Context *this,string *rule,
          function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
          *arg_check)

{
  State *pSVar1;
  _Elt_pointer pRVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  _Elt_pointer pRVar6;
  _Elt_pointer __x;
  _Map_pointer ppRVar7;
  bool bVar8;
  Rule check_rule;
  undefined1 local_278 [80];
  _Alloc_hider local_228;
  size_t local_220;
  char local_218 [16];
  deque<util::variant,_std::allocator<util::variant>_> local_208;
  Action local_1b8;
  
  pSVar1 = this->state;
  if (pSVar1 == (State *)0x0) {
    bVar8 = false;
  }
  else {
    __x = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur;
    pRVar2 = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    bVar8 = __x != pRVar2;
    if (bVar8) {
      pRVar6 = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last;
      ppRVar7 = (pSVar1->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::deque
                  ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)local_278,
                   (deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)__x);
        local_228._M_p = local_218;
        pcVar3 = (__x->expr).function._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_228,pcVar3,pcVar3 + (__x->expr).function._M_string_length);
        std::deque<util::variant,_std::allocator<util::variant>_>::deque
                  (&local_208,&(__x->expr).args);
        Action::Action(&local_1b8,&__x->action);
        if ((local_220 == rule->_M_string_length) &&
           ((local_220 == 0 ||
            (iVar5 = bcmp(local_228._M_p,(rule->_M_dataplus)._M_p,local_220), iVar5 == 0)))) {
          if ((arg_check->super__Function_base)._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          bVar4 = (*arg_check->_M_invoker)((_Any_data *)arg_check,&local_208);
          if (bVar4) {
            (*this->_vptr_Context[1])(this,&local_1b8);
            Rule::~Rule((Rule *)local_278);
            return bVar8;
          }
        }
        Rule::~Rule((Rule *)local_278);
        __x = __x + 1;
        if (__x == pRVar6) {
          __x = ppRVar7[1];
          ppRVar7 = ppRVar7 + 1;
          pRVar6 = __x + 1;
        }
        bVar8 = __x != pRVar2;
      } while (bVar8);
    }
  }
  return bVar8;
}

Assistant:

bool Context::TriggerRule(std::string rule, std::function<bool(const std::deque<util::variant>&)> arg_check)
	{
		if (!this->state)
			return false;

		UTIL_FOREACH(this->state->rules, check_rule)
		{
			if (check_rule.expr.function == rule && arg_check(check_rule.expr.args))
			{
				this->DoAction(check_rule.action);
				// *this may not be valid here
				return true;
			}
		}

		return false;
	}